

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O1

int xmlNanoHTTPFetch(char *URL,char *filename,char **contentType)

{
  int iVar1;
  int __fd;
  xmlNanoHTTPCtxtPtr ctxt_00;
  ssize_t sVar2;
  xmlNanoHTTPCtxtPtr ctxt;
  char *buf;
  int len;
  char *local_38;
  int local_2c;
  
  local_38 = (char *)0x0;
  iVar1 = -1;
  if (filename != (char *)0x0) {
    if (contentType != (char **)0x0) {
      *contentType = (char *)0x0;
    }
    __fd = 0;
    ctxt_00 = (xmlNanoHTTPCtxtPtr)
              xmlNanoHTTPMethodRedir
                        (URL,(char *)0x0,(char *)0x0,contentType,(char **)0x0,(char *)0x0,0);
    if (ctxt_00 != (xmlNanoHTTPCtxtPtr)0x0) {
      iVar1 = strcmp(filename,"-");
      if ((iVar1 != 0) && (__fd = open64(filename,0x41,0x1a4), __fd < 0)) {
        xmlNanoHTTPFreeCtxt(ctxt_00);
        if (contentType == (char **)0x0) {
          return -1;
        }
        if (*contentType == (char *)0x0) {
          return -1;
        }
        (*xmlFree)(*contentType);
        *contentType = (char *)0x0;
        return -1;
      }
      xmlNanoHTTPFetchContent(ctxt_00,&local_38,&local_2c);
      if ((long)local_2c < 1) {
        iVar1 = 0;
      }
      else {
        sVar2 = write(__fd,local_38,(long)local_2c);
        iVar1 = -(uint)(sVar2 == -1);
      }
      xmlNanoHTTPFreeCtxt(ctxt_00);
      close(__fd);
    }
  }
  return iVar1;
}

Assistant:

int
xmlNanoHTTPFetch(const char *URL, const char *filename, char **contentType) {
    void *ctxt = NULL;
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if (filename == NULL) return(-1);
    ctxt = xmlNanoHTTPOpen(URL, contentType);
    if (ctxt == NULL) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 00644);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    if ((contentType != NULL) && (*contentType != NULL)) {
	        xmlFree(*contentType);
		*contentType = NULL;
	    }
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}